

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::FirstMatchAssertionExpr::fromSyntax
          (FirstMatchSequenceExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  undefined4 extraout_var;
  FirstMatchAssertionExpr *pFVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_38;
  AssertionExpr *this_00;
  
  this = ((context->scope).ptr)->compilation;
  iVar1 = AssertionExpr::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence(this_00,context,(DiagCode)0x350008);
  local_38 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0);
  if (syntax->matchList != (SequenceMatchListSyntax *)0x0) {
    local_38 = bindMatchItems(syntax->matchList,context,this_00);
  }
  pFVar2 = BumpAllocator::
           emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                     (&this->super_BumpAllocator,this_00,&local_38);
  return &pFVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& FirstMatchAssertionExpr::fromSyntax(const FirstMatchSequenceExprSyntax& syntax,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& seq = bind(*syntax.expr, context);
    seq.requireSequence(context);

    std::span<const Expression* const> matchItems;
    if (syntax.matchList)
        matchItems = bindMatchItems(*syntax.matchList, context, seq);

    return *comp.emplace<FirstMatchAssertionExpr>(seq, matchItems);
}